

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

PersistentColumnData * __thiscall
duckdb::ListColumnData::Serialize(PersistentColumnData *__return_storage_ptr__,ListColumnData *this)

{
  pointer pCVar1;
  PersistentColumnData PStack_58;
  
  ColumnData::Serialize(__return_storage_ptr__,&this->super_ColumnData);
  ColumnData::Serialize(&PStack_58,&(this->validity).super_ColumnData);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(__return_storage_ptr__->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&PStack_58);
  PersistentColumnData::~PersistentColumnData(&PStack_58);
  pCVar1 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  (*pCVar1->_vptr_ColumnData[0x1f])(&PStack_58,pCVar1);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(__return_storage_ptr__->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&PStack_58);
  PersistentColumnData::~PersistentColumnData(&PStack_58);
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData ListColumnData::Serialize() {
	auto persistent_data = ColumnData::Serialize();
	persistent_data.child_columns.push_back(validity.Serialize());
	persistent_data.child_columns.push_back(child_column->Serialize());
	return persistent_data;
}